

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *returnvalue;
  void *returnvalue_00;
  void *returnvalue_01;
  FILE *__s;
  bool bVar4;
  double dVar5;
  int retval;
  SUNContext ctx;
  sunrealtype t;
  MRIStepInnerStepper inner_stepper;
  double local_88;
  long nfse;
  long nstf;
  long nsts;
  void *local_68;
  void *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long nff;
  
  inner_stepper = (MRIStepInnerStepper)0x0;
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    puts("\nBrusselator ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff3333333333333,
           0x4008cccccccccccd,0x4008000000000000);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",0x3ff0000000000000,
           0x400c000000000000,0x3f847ae147ae147b);
    printf("    hs = %g,  hf = %g\n\n",0x3f9999999999999a,0x3f50624dd2f1a9fc);
    local_58 = 0x3ff0000000000000;
    uStack_50 = 0x400c000000000000;
    local_48 = 0x3f847ae147ae147b;
    returnvalue = (long *)N_VNew_Serial(3,ctx);
    iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
      *puVar1 = 0x3ff3333333333333;
      puVar1[1] = 0x4008cccccccccccd;
      puVar1[2] = 0x4008000000000000;
      returnvalue_00 = (void *)ARKStepCreate(0,ff,0,returnvalue,ctx);
      local_68 = returnvalue_00;
      iVar2 = check_retval(returnvalue_00,"ARKStepCreate",0);
      if (iVar2 == 0) {
        retval = ARKodeSetUserData(returnvalue_00,&local_58);
        iVar3 = 1;
        iVar2 = check_retval(&retval,"ARKodeSetUserData",1);
        if (iVar2 == 0) {
          retval = ARKStepSetTableNum(returnvalue_00,0xffffffffffffffff,0xc);
          iVar3 = 1;
          iVar2 = check_retval(&retval,"ARKStepSetTableNum",1);
          if (iVar2 == 0) {
            retval = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,returnvalue_00);
            iVar3 = 1;
            iVar2 = check_retval(&retval,"ARKodeSetFixedStep",1);
            if (iVar2 == 0) {
              retval = ARKodeCreateMRIStepInnerStepper(returnvalue_00,&inner_stepper);
              iVar3 = 1;
              iVar2 = check_retval(&retval,"ARKodeCreateMRIStepInnerStepper",1);
              if (iVar2 == 0) {
                returnvalue_01 = (void *)MRIStepCreate(0,fs,0,returnvalue,inner_stepper,ctx);
                local_60 = returnvalue_01;
                iVar2 = check_retval(returnvalue_01,"MRIStepCreate",0);
                if (iVar2 == 0) {
                  retval = ARKodeSetUserData(returnvalue_01,&local_58);
                  iVar3 = 1;
                  iVar2 = check_retval(&retval,"ARKodeSetUserData",1);
                  if (iVar2 == 0) {
                    retval = ARKodeSetFixedStep(0x3f9999999999999a,returnvalue_01);
                    iVar3 = 1;
                    iVar2 = check_retval(&retval,"ARKodeSetFixedStep",1);
                    if (iVar2 == 0) {
                      __s = fopen("ark_brusselator_mri_solution.txt","w");
                      fwrite("# t u v w\n",10,1,__s);
                      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                      fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                      t = 0.0;
                      puts("        t           u           v           w");
                      puts("   ----------------------------------------------");
                      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                      printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",0,*puVar1,puVar1[1],puVar1[2]);
                      iVar2 = 0x14;
                      local_88 = 0.1;
                      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
                        retval = ARKodeEvolve(local_88,returnvalue_01,returnvalue,&t,1);
                        iVar3 = check_retval(&retval,"ARKodeEvolve",1);
                        if (iVar3 != 0) break;
                        puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                        printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",t,*puVar1,puVar1[1],puVar1[2]);
                        puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                        fprintf(__s," %.16e %.16e %.16e %.16e\n",t,*puVar1,puVar1[1],puVar1[2]);
                        dVar5 = local_88 + 0.1;
                        local_88 = 2.0;
                        if (dVar5 <= 2.0) {
                          local_88 = dVar5;
                        }
                      }
                      puts("   ----------------------------------------------");
                      fclose(__s);
                      retval = ARKodeGetNumSteps(returnvalue_01,&nsts);
                      check_retval(&retval,"ARKodeGetNumSteps",1);
                      iVar3 = 0;
                      retval = ARKodeGetNumRhsEvals(returnvalue_01,0,&nfse);
                      check_retval(&retval,"ARKodeGetNumRhsEvals",1);
                      retval = ARKodeGetNumSteps(returnvalue_00,&nstf);
                      check_retval(&retval,"ARKodeGetNumSteps",1);
                      retval = ARKodeGetNumRhsEvals(returnvalue_00,0);
                      check_retval(&retval,"ARKodeGetNumRhsEvals",1);
                      puts("\nFinal Solver Statistics:");
                      printf("   Steps: nsts = %li, nstf = %li\n",nsts,nstf);
                      printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",nfse,nff);
                      N_VDestroy(returnvalue);
                      ARKodeFree(&local_68);
                      MRIStepInnerStepper_Free(&inner_stepper);
                      ARKodeFree(&local_60);
                      SUNContext_Free(&ctx);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(2.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.025);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.001);     /* fast step size */
  sunrealtype a, b, ep;                      /* ODE parameters */
  sunrealtype u0, v0, w0;                    /* initial conditions */
  sunrealtype rdata[3];                      /* user data */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set up the test problem parameters */
  a  = SUN_RCONST(1.0);
  b  = SUN_RCONST(3.5);
  ep = SUN_RCONST(1.0e-2);

  /* Set the initial contions */
  u0 = SUN_RCONST(1.2);
  v0 = SUN_RCONST(3.1);
  w0 = SUN_RCONST(3.0);

  /* Initial problem output */
  printf("\nBrusselator ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Set parameters in user data */
  rdata[0] = a;
  rdata[1] = b;
  rdata[2] = ep;

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass rdata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_brusselator_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}